

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * Util::getIndent_abi_cxx11_(int level)

{
  size_type sVar1;
  mapped_type *pmVar2;
  int iVar3;
  int in_ESI;
  string *in_RDI;
  string tmp;
  int local_44;
  _Alloc_hider local_40;
  size_type local_38;
  char local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  
  local_38 = 0;
  local_30 = '\0';
  local_44 = in_ESI;
  local_40._M_p = &local_30;
  sVar1 = std::
          _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&indentCache_abi_cxx11_._M_h,&local_44);
  if (sVar1 == 0) {
    if (0 < local_44) {
      iVar3 = 0;
      do {
        std::__cxx11::string::push_back((char)&local_40);
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_44);
    }
    pmVar2 = std::__detail::
             _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&indentCache_abi_cxx11_,&local_44);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_40._M_p == &local_30) {
      (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_28;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_40._M_p;
      (in_RDI->field_2)._M_allocated_capacity = CONCAT71(uStack_2f,local_30);
    }
    in_RDI->_M_string_length = local_38;
    local_38 = 0;
    local_30 = '\0';
    local_40._M_p = &local_30;
  }
  else {
    std::__detail::
    _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&indentCache_abi_cxx11_,&local_44);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
  }
  if (local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  return in_RDI;
}

Assistant:

std::string Util::getIndent(int level)
{
	std::string tmp;

	if (indentCache.count(level) > 0)
		return indentCache[level];

	for (int i = 0; i < level; i++)
		tmp += '\t';

	indentCache[level] = tmp;

	return tmp;
}